

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

BorderAmounts * __thiscall
CoreML::Specification::PaddingLayerParams::_internal_mutable_paddingamounts
          (PaddingLayerParams *this)

{
  Arena *arena;
  BorderAmounts *pBVar1;
  BorderAmounts *p;
  PaddingLayerParams *this_local;
  
  if (this->paddingamounts_ == (BorderAmounts *)0x0) {
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pBVar1 = google::protobuf::MessageLite::CreateMaybeMessage<CoreML::Specification::BorderAmounts>
                       (arena);
    this->paddingamounts_ = pBVar1;
  }
  return this->paddingamounts_;
}

Assistant:

inline ::CoreML::Specification::BorderAmounts* PaddingLayerParams::_internal_mutable_paddingamounts() {
  
  if (paddingamounts_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::BorderAmounts>(GetArenaForAllocation());
    paddingamounts_ = p;
  }
  return paddingamounts_;
}